

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::pnm_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::pnm_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<double> *original_costs,
            double cost_constant)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *this_00;
  context *ctx;
  bool bVar5;
  undefined8 uVar6;
  unique_ptr<double[],_std::default_delete<double[]>_> uVar7;
  unique_ptr<double[],_std::default_delete<double[]>_> P;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  rep rVar12;
  undefined8 extraout_RAX;
  long lVar13;
  result_status rVar14;
  random_engine *rng;
  int iVar15;
  long lVar16;
  pnm_observer *x_optimistic;
  pnm_observer *x_pessimistic;
  double *in_R9;
  ulong uVar17;
  double dVar18;
  undefined1 auVar20 [16];
  double dVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM4_Qb;
  string_view filename;
  bit_array x;
  quadratic_cost_type<double> norm_costs;
  compute_order compute;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  slv;
  pnm_observer obs;
  double local_3f0;
  undefined1 local_3d8 [32];
  double local_3b8;
  quadratic_cost_type<double> *local_3b0;
  double local_3a8;
  ulong local_3a0;
  int local_394;
  double local_390;
  double local_388;
  double local_380;
  quadratic_cost_type<double> local_378;
  double local_358;
  double local_350;
  compute_order local_348;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  local_310;
  pnm_observer local_288;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_3a8 = cost_constant;
  bit_array_impl::bit_array_impl((bit_array_impl *)local_3d8,variables);
  this_00 = this->m_ctx;
  normalize_costs<double,baryonyx::itm::quadratic_cost_type<double>>
            (&local_378,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<double> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             (int)in_R9);
  local_388 = (this_00->parameters).kappa_step;
  local_380 = (this_00->parameters).kappa_max;
  local_390 = (this_00->parameters).alpha;
  local_3b8 = (this_00->parameters).theta;
  local_3d8._24_8_ = (this_00->parameters).delta;
  if ((double)local_3d8._24_8_ < 0.0) {
    ctx = this->m_ctx;
    local_288.m_pi_obs._0_8_ = local_3b8;
    info<>(ctx,"  - delta not defined, compute it:\n");
    auVar23._0_8_ = (random_engine *)quadratic_cost_type<double>::min(&local_378,variables);
    auVar23._8_56_ = extraout_var;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_288.m_pi_obs._0_8_;
    auVar1 = vfnmadd132sd_fma(auVar23._0_16_,auVar23._0_16_,auVar1);
    local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar1._0_8_;
    local_310.rng = auVar23._0_8_;
    info<double,double,double>
              ((baryonyx *)ctx,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n",
               (char *)&local_348,(double *)&local_310,(double *)&local_288,in_R9);
    local_3d8._24_8_ =
         local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_350 = (this_00->parameters).pushing_k_factor;
  local_358 = (this_00->parameters).pushing_objective_amplifier;
  local_3a0 = (ulong)(this_00->parameters).w;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  ::solver_random_inequalities_101coeff
            (&local_310,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_378,constraints);
  compute_order::compute_order(&local_348,(this_00->parameters).order,variables);
  dVar19 = (this->m_ctx->parameters).init_policy_random;
  local_288.m_pi_obs.constraints = 0;
  local_288.m_pi_obs._4_4_ = 0;
  local_288.m_pi_obs.m_pnm.m_buffer._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  iVar4 = (this_00->parameters).init_policy;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)local_3d8,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = (pnm_observer *)local_3d8;
      x_optimistic = &local_288;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_00181ca1;
      rng = this->m_rng;
      x_pessimistic = &local_288;
      x_optimistic = (pnm_observer *)local_3d8;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_00181ca1:
  local_3b0 = original_costs;
  if (local_3d8._0_4_ != 0) {
    iVar15 = 0;
    do {
      dVar18 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar18 < dVar19) {
        bit_array_impl::invert((bit_array_impl *)local_3d8,iVar15);
      }
      iVar15 = iVar15 + 1;
    } while (local_3d8._0_4_ != iVar15);
  }
  if (local_288.m_pi_obs.m_pnm.m_buffer._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    operator_delete__((void *)local_288.m_pi_obs.m_pnm.m_buffer._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  dVar19 = (this_00->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  pnm_observer::pnm_observer
            (&local_288,filename,local_310.m,local_310.n,(this_00->parameters).limit);
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar12;
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar12;
  compute_order::
  init<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
            (&local_348,&local_310,(bit_array *)local_3d8);
  auVar23 = ZEXT864((ulong)dVar19);
  local_394 = variables;
  if ((this_00->parameters).limit == 0) {
    uVar9 = 0;
  }
  else {
    iVar15 = 0x7fffffff;
    lVar16 = 0;
    local_3d8._20_4_ = 0;
    do {
      auVar20._0_8_ = auVar23._0_8_;
      iVar8 = compute_order::
              run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array,double>
                        (&local_348,&local_310,(bit_array *)local_3d8,this->m_rng,auVar20._0_8_,
                         (double)local_3d8._24_8_,local_3b8);
      P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_310.P;
      uVar7._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_310.pi;
      details::pi_pnm_observer::make_observation<double>
                (&local_288.m_pi_obs,&local_310.ap,
                 (double *)
                 local_310.P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                 .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 local_310.pi._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      details::ap_pnm_observer::make_observation<double>
                (&local_288.m_ap_obs,&local_310.ap,
                 (double *)
                 P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 uVar7._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      if (iVar8 == 0) {
        dVar19 = quadratic_cost_type<double>::results(local_3b0,(bit_array *)local_3d8,local_3a8);
        store_if_better(this,(bit_array *)local_3d8,dVar19,lVar16);
        local_3d8._20_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        iVar15 = 0;
        bVar5 = false;
        local_3f0 = auVar20._0_8_;
LAB_00181e80:
        auVar23 = ZEXT864((ulong)local_3f0);
      }
      else {
        if (iVar8 < iVar15) {
          store_if_better(this,(bit_array *)local_3d8,iVar8,lVar16);
          iVar15 = iVar8;
        }
        if ((long)local_3a0 < lVar16) {
          auVar24._0_8_ = pow((double)iVar8 / (double)local_310.m,local_390);
          auVar24._8_56_ = extraout_var_00;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = auVar20._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_388;
          auVar20 = vfmadd231sd_fma(auVar26,auVar24._0_16_,auVar2);
        }
        else {
          auVar20._8_8_ = 0;
        }
        auVar23 = ZEXT1664(auVar20);
        rVar14 = kappa_max_reached;
        local_3f0 = auVar20._0_8_;
        if (local_380 < local_3f0) {
LAB_00181edf:
          __return_storage_ptr__->status = rVar14;
          bVar5 = false;
        }
        else {
          lVar13 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar13;
          dVar19 = (this->m_ctx->parameters).time_limit;
          bVar5 = true;
          if (dVar19 <= 0.0) goto LAB_00181e80;
          rVar14 = time_limit_reached;
          auVar23 = ZEXT864((ulong)local_3f0);
          if (dVar19 < (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0) goto LAB_00181edf;
        }
      }
      uVar9 = local_3d8._20_4_;
    } while ((bVar5) && (lVar16 = lVar16 + 1, lVar16 != (this_00->parameters).limit));
  }
  if ((uVar9 & 1) == 0) {
    __return_storage_ptr__->status = limit_reached;
  }
  else if (0 < (this_00->parameters).pushes_limit) {
    iVar15 = 0;
    iVar8 = 0;
    do {
      local_3f0 = auVar23._0_8_;
      iVar10 = compute_order::
               push_and_run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array,double>
                         (&local_348,&local_310,(bit_array *)local_3d8,this->m_rng,
                          local_3f0 * local_350,(double)local_3d8._24_8_,local_3b8,local_358);
      if (iVar10 == 0) {
        dVar19 = quadratic_cost_type<double>::results(local_3b0,(bit_array *)local_3d8,local_3a8);
        store_if_better(this,(bit_array *)local_3d8,dVar19,
                        (long)~((this_00->parameters).pushing_iteration_limit * iVar8));
      }
      lVar16 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar16;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = (this->m_ctx->parameters).time_limit;
      auVar21._0_8_ = (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0;
      auVar21._8_8_ = in_XMM4_Qb;
      uVar6 = vcmppd_avx512vl(auVar27,ZEXT816(0),6);
      uVar17 = vcmppd_avx512vl(auVar27,auVar21,1);
      uVar17 = ((byte)uVar6 & 3) & uVar17;
      local_3a0 = CONCAT62(local_3a0._2_6_,(short)uVar17);
      if ((uVar17 & 1) == 0) {
        auVar23 = ZEXT864((ulong)local_3f0);
        if (0 < (this_00->parameters).pushing_iteration_limit) {
          iVar10 = 1;
          do {
            auVar22._0_8_ = auVar23._0_8_;
            iVar11 = compute_order::
                     run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array,double>
                               (&local_348,&local_310,(bit_array *)local_3d8,this->m_rng,
                                auVar22._0_8_,(double)local_3d8._24_8_,local_3b8);
            if (iVar11 == 0) {
              dVar19 = quadratic_cost_type<double>::results
                                 (local_3b0,(bit_array *)local_3d8,local_3a8);
              store_if_better(this,(bit_array *)local_3d8,dVar19,
                              (long)((this_00->parameters).pushing_iteration_limit * iVar15 - iVar10
                                    ));
              auVar23 = ZEXT864((ulong)auVar22._0_8_);
              break;
            }
            if ((double)(iVar10 + -1) <= (this_00->parameters).w) {
              auVar22._8_8_ = 0;
            }
            else {
              auVar25._0_8_ = pow((double)iVar11 / (double)local_310.m,local_390);
              auVar25._8_56_ = extraout_var_01;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = auVar22._0_8_;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_388;
              auVar22 = vfmadd231sd_fma(auVar28,auVar25._0_16_,auVar3);
            }
            auVar23 = ZEXT1664(auVar22);
            local_3f0 = auVar22._0_8_;
            if (local_380 < local_3f0) break;
            lVar16 = std::chrono::_V2::steady_clock::now();
            (this->m_end).__d.__r = lVar16;
            dVar19 = (this->m_ctx->parameters).time_limit;
            if ((0.0 < dVar19) &&
               (dVar19 < (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0))
            goto LAB_00181feb;
            auVar23 = ZEXT864((ulong)local_3f0);
            bVar5 = iVar10 < (this_00->parameters).pushing_iteration_limit;
            iVar10 = iVar10 + 1;
          } while (bVar5);
        }
      }
      else {
LAB_00181feb:
        auVar23 = ZEXT864((ulong)local_3f0);
      }
      if ((local_3a0 & 1) != 0) break;
      iVar8 = iVar8 + 1;
      iVar15 = iVar15 + -1;
    } while (iVar8 < (this_00->parameters).pushes_limit);
  }
  iVar15 = local_394;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar15);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_ap_obs.m_basename._M_dataplus._M_p != &local_288.m_ap_obs.m_basename.field_2) {
    operator_delete(local_288.m_ap_obs.m_basename._M_dataplus._M_p,
                    local_288.m_ap_obs.m_basename.field_2._M_allocated_capacity + 1);
  }
  pnm_vector::~pnm_vector(&local_288.m_pi_obs.m_pnm);
  if (local_348.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_348.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  ::~solver_random_inequalities_101coeff(&local_310);
  if ((_Head_base<0UL,_int_*,_false>)
      local_378.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
    operator_delete__((void *)local_378.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_378.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if (local_378.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl
      != (__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          )0x0) {
    operator_delete__((void *)local_378.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_378.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          )0x0;
  if (local_378.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_378.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)local_3d8._8_8_ !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_3d8._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }